

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_int>::test_vectordivide_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_int> *this,uint denom,
          divider<unsigned_int,_(libdivide::Branching)0> *the_divider)

{
  uint uVar1;
  size_t j;
  long lVar2;
  size_t i;
  long lVar3;
  uint *numers;
  char mem [128];
  
  numers = (uint *)(mem + 0x38);
  for (lVar3 = 0; lVar3 != 10000; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar1 = get_random(this);
      numers[lVar2] = uVar1;
    }
    test_vec<long_long__vector(2),(libdivide::Branching)0>(this,numers,0x10,denom,the_divider);
    test_vec<long_long__vector(4),(libdivide::Branching)0>(this,numers,0x10,denom,the_divider);
    test_vec<long_long__vector(8),(libdivide::Branching)0>(this,numers,0x10,denom,the_divider);
  }
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }